

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

void __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,UnitList **units)

{
  bool bVar1;
  Clause *pCVar2;
  List<Kernel::Unit_*> **in_RSI;
  Unit *in_RDI;
  Clause *cl2;
  Clause *cl;
  Unit *unit;
  DelIterator uit;
  Clause *in_stack_00000090;
  EqualityProxy *in_stack_00000098;
  Clause *in_stack_ffffffffffffffc0;
  DelIterator local_28;
  
  Lib::List<Kernel::Unit_*>::DelIterator::DelIterator(&local_28,in_RSI);
  while (bVar1 = Lib::List<Kernel::Unit_*>::DelIterator::hasNext((DelIterator *)in_RDI), bVar1) {
    pCVar2 = (Clause *)
             Lib::List<Kernel::Unit_*>::DelIterator::next((DelIterator *)in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = apply(in_stack_00000098,in_stack_00000090);
    if (pCVar2 != in_stack_ffffffffffffffc0) {
      Lib::List<Kernel::Unit_*>::DelIterator::replace
                ((DelIterator *)in_stack_ffffffffffffffc0,in_RDI);
    }
  }
  addAxioms((EqualityProxy *)in_stack_ffffffffffffffc0,(UnitList **)in_RDI);
  return;
}

Assistant:

void EqualityProxy::apply(UnitList*& units)
{
  UnitList::DelIterator uit(units);
  while (uit.hasNext()) {
    Unit* unit = uit.next();
    ASS (unit->isClause());
    Clause* cl = static_cast<Clause*>(unit);
    Clause* cl2 = apply(cl);
    if (cl != cl2) {
      uit.replace(cl2);
    }
  }

  addAxioms(units);
}